

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O3

void __thiscall
miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>
          (Node<CPubKey> *this,KeyConverter *ctx)

{
  _Base_ptr p_Var1;
  _Rb_tree_node_base *p_Var2;
  long lVar3;
  long lVar4;
  _Link_type p_Var5;
  _Base_ptr p_Var6;
  _Link_type p_Var7;
  _Link_type p_Var8;
  Comp CVar9;
  pointer poVar10;
  pointer poVar11;
  bool bVar12;
  bool bVar13;
  byte bVar14;
  _Rb_tree_node_base *__tmp;
  _Link_type p_Var15;
  pointer poVar16;
  _Rb_tree_node_base *p_Var17;
  _Rb_tree_node_base *p_Var18;
  long lVar19;
  ulong uVar20;
  undefined8 *puVar21;
  _Rb_tree_color _Var22;
  bool *in_RCX;
  size_t *psVar23;
  long lVar24;
  _Link_type p_Var25;
  _Rb_tree_node_base *p_Var26;
  ulong uVar27;
  void *pvVar28;
  _Self __tmp_2;
  _Link_type p_Var29;
  _Link_type *pp_Var30;
  pointer poVar31;
  _Link_type p_Var32;
  _Rb_tree_impl<Comp,_false> *__src_impl;
  pointer poVar33;
  ulong uVar34;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar35;
  vector<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
  results;
  vector<StackElem,_std::allocator<StackElem>_> stack;
  vector<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
  local_198;
  void *local_178;
  void *pvStack_170;
  long local_168;
  undefined1 local_158 [16];
  _Base_ptr local_148;
  _Link_type local_140;
  _Link_type p_Stack_138;
  _Link_type local_130;
  _Base_ptr local_128;
  _Rb_tree_node_base local_120;
  undefined1 local_100 [32];
  _Base_ptr local_e0;
  _Rb_tree_node_base *local_d8;
  _Rb_tree_node_base *p_Stack_d0;
  undefined1 local_c8 [40];
  _Base_ptr local_a0;
  _Link_type local_98;
  _Link_type p_Stack_90;
  _Link_type local_88;
  uchar local_80;
  byte local_78;
  Comp local_70;
  _Rb_tree_color local_68 [2];
  _Base_ptr local_60;
  _Link_type local_58;
  _Link_type local_50;
  _Link_type local_48;
  byte local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_168 = 0;
  local_178 = (void *)0x0;
  pvStack_170 = (void *)0x0;
  local_198.
  super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.
  super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._24_8_ = local_c8._24_8_ & 0xffffffff00000000;
  std::
  vector<miniscript::Node<CPubKey>::TreeEvalMaybe<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::Comp,std::allocator<CPubKey>>>,miniscript::Node<CPubKey>::TreeEval<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::Comp,std::allocator<CPubKey>>>,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::{lambda(miniscript::Node<CPubKey>const&,Span<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>(auto:1_const&)const::Comp,std::allocator<CPubKey>>>>)#1}>(miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::{lambda(miniscript::Node<CPubKey>const&,Span<std...amespace)::KeyConverter>(auto:1_const&)const::Comp,std::allocator<CPubKey>>>>)#1})const::StackElem>>
  ::
  emplace_back<miniscript::Node<CPubKey>const&,int,miniscript::Node<CPubKey>::TreeEval<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::Comp,std::allocator<CPubKey>>>,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>(auto:1_const&)const::Comp,std::allocator<CPubKey>>>>)_1_>(miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>(auto:1_const&)const::Comp,std::allocator<CPubKey>>>>)_1_)const::DummyState>
            ((vector<miniscript::Node<CPubKey>::TreeEvalMaybe<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::Comp,std::allocator<CPubKey>>>,miniscript::Node<CPubKey>::TreeEval<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::Comp,std::allocator<CPubKey>>>,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>(auto:1_const&)const::Comp,std::allocator<CPubKey>>>>)_1_>(miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<std___amespace)::KeyConverter>(auto:1_const&)const::Comp,std::allocator<CPubKey>>>>__1__const__StackElem>>
              *)&local_178,this,(int *)(local_c8 + 0x18),in_RCX);
  if (pvStack_170 == local_178) {
    poVar31 = (pointer)0x0;
    poVar16 = (pointer)0x0;
  }
  else {
    poVar31 = (pointer)0x0;
    pvVar28 = pvStack_170;
    do {
      p_Var25 = (_Link_type)(local_158 + 8);
      lVar19 = *(long *)((long)pvVar28 + -0x18);
      p_Var29 = *(_Link_type *)((long)pvVar28 + -0x10);
      lVar3 = *(long *)(lVar19 + 0x38);
      lVar4 = *(long *)(lVar19 + 0x40);
      p_Var15 = (_Link_type)(lVar4 - lVar3 >> 4);
      if (p_Var29 < p_Var15) {
        *(byte **)((long)pvVar28 + -0x10) =
             (byte *)((long)&(p_Var29->super__Rb_tree_node_base)._M_color + 1);
        local_c8._24_8_ = local_c8._24_8_ & 0xffffffff00000000;
        std::
        vector<miniscript::Node<CPubKey>::TreeEvalMaybe<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::Comp,std::allocator<CPubKey>>>,miniscript::Node<CPubKey>::TreeEval<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::Comp,std::allocator<CPubKey>>>,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::{lambda(miniscript::Node<CPubKey>const&,Span<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>(auto:1_const&)const::Comp,std::allocator<CPubKey>>>>)#1}>(miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::{lambda(miniscript::Node<CPubKey>const&,Span<std...amespace)::KeyConverter>(auto:1_const&)const::Comp,std::allocator<CPubKey>>>>)#1})const::StackElem>>
        ::
        emplace_back<miniscript::Node<CPubKey>const&,int,miniscript::Node<CPubKey>::TreeEval<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::Comp,std::allocator<CPubKey>>>,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>(auto:1_const&)const::Comp,std::allocator<CPubKey>>>>)_1_>(miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>(auto:1_const&)const::Comp,std::allocator<CPubKey>>>>)_1_)const::DummyState>
                  ((vector<miniscript::Node<CPubKey>::TreeEvalMaybe<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::Comp,std::allocator<CPubKey>>>,miniscript::Node<CPubKey>::TreeEval<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::Comp,std::allocator<CPubKey>>>,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>(auto:1_const&)const::Comp,std::allocator<CPubKey>>>>)_1_>(miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<std___amespace)::KeyConverter>(auto:1_const&)const::Comp,std::allocator<CPubKey>>>>__1__const__StackElem>>
                    *)&local_178,*(Node<CPubKey> **)((bool *)((long)p_Var29 * 0x10) + lVar3),
                   (int *)(local_c8 + 0x18),(bool *)((long)p_Var29 * 0x10));
        pvVar28 = pvStack_170;
      }
      else {
        p_Var29 = (_Link_type)
                  (((long)poVar31 -
                    (long)local_198.
                          super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
        if (p_Var29 < p_Var15) {
          __assert_fail("results.size() >= node.subs.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x273,
                        "std::optional<Result> miniscript::Node<CPubKey>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = CPubKey, Result = std::optional<std::set<CPubKey, Comp>>, State = DummyState, DownFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:678:13), UpFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:679:13)]"
                       );
        }
        if ((*(char *)(lVar19 + 0xa1) == '\x01') && (*(char *)(lVar19 + 0xa0) != '\0')) {
LAB_004859e9:
          local_80 = '\0';
        }
        else {
          poVar33 = (pointer)((long)local_198.
                                    super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                             (long)p_Var15 * -0x38 +
                             ((long)poVar31 -
                             (long)local_198.
                                   super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start));
          poVar16 = poVar33;
          if (lVar4 != lVar3) {
            do {
              if ((poVar16->
                  super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                  )._M_payload.
                  super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                  .super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>.
                  _M_engaged == false) {
                *(undefined2 *)(lVar19 + 0xa0) = 0x101;
                goto LAB_004859e9;
              }
              poVar16 = poVar16 + 1;
            } while (poVar16 != poVar31);
          }
          p_Var15 = *(_Link_type *)(lVar19 + 8);
          p_Var5 = *(_Link_type *)(lVar19 + 0x10);
          local_158._8_4_ = _S_red;
          local_148 = (_Base_ptr)0x0;
          local_130 = (_Link_type)0x0;
          lVar24 = (long)p_Var5 - (long)p_Var15;
          local_158._0_8_ = ctx;
          local_140 = p_Var25;
          p_Stack_138 = p_Var25;
          if (lVar24 != 0) {
            do {
              if ((local_130 == (_Link_type)0x0) ||
                 (p_Var29 = p_Var15,
                 bVar12 = ::operator<((CPubKey *)&p_Stack_138->_M_storage,(CPubKey *)p_Var15),
                 !bVar12)) {
                p_Var29 = p_Var15;
                pVar35 = std::
                         _Rb_tree<CPubKey,_CPubKey,_std::_Identity<CPubKey>,_Comp,_std::allocator<CPubKey>_>
                         ::_M_get_insert_unique_pos
                                   ((_Rb_tree<CPubKey,_CPubKey,_std::_Identity<CPubKey>,_Comp,_std::allocator<CPubKey>_>
                                     *)local_158,(key_type *)p_Var15);
                p_Var25 = (_Link_type)pVar35.second;
                bVar12 = pVar35.first != (_Rb_tree_node_base *)0x0;
              }
              else {
                bVar12 = false;
                p_Var25 = p_Stack_138;
              }
              if (p_Var25 != (_Link_type)0x0) {
                bVar13 = true;
                if (!bVar12 && (_Link_type)(local_158 + 8) != p_Var25) {
                  bVar13 = ::operator<((CPubKey *)p_Var15,(CPubKey *)&p_Var25->_M_storage);
                }
                p_Var29 = (_Link_type)operator_new(0x68);
                memcpy(&p_Var29->_M_storage,p_Var15,0x41);
                std::_Rb_tree_insert_and_rebalance
                          (bVar13,(_Rb_tree_node_base *)p_Var29,(_Rb_tree_node_base *)p_Var25,
                           (_Rb_tree_node_base *)(local_158 + 8));
                local_130 = (_Link_type)((long)&(local_130->super__Rb_tree_node_base)._M_color + 1);
              }
              p_Var15 = (_Link_type)((p_Var15->_M_storage)._M_storage + 0x21);
            } while (p_Var15 != p_Var5);
          }
          p_Var15 = (_Link_type)(lVar24 * 0xfc0fc0fc0fc0fc1);
          if (local_130 == p_Var15) {
            p_Var29 = p_Var15;
            if (lVar4 != lVar3) {
              do {
                p_Var32 = (_Link_type)(local_158 + 8);
                p_Var5 = *(_Link_type *)
                          ((long)&(poVar33->
                                  super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                                  )._M_payload.
                                  super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                                  ._M_payload + 0x28);
                p_Var25 = p_Var29;
                if (p_Var29 < p_Var5) {
                  p_Var6 = *(_Base_ptr *)
                            ((long)&(poVar33->
                                    super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                                    )._M_payload.
                                    super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                                    ._M_payload + 0x10);
                  if (local_148 == (_Base_ptr)0x0) {
                    if (p_Var6 != (_Base_ptr)0x0) {
                      p_Var1 = (_Base_ptr)
                               ((long)&(poVar33->
                                       super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                                       )._M_payload.
                                       super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                                       .
                                       super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                                       ._M_payload + 8);
                      local_158._8_4_ =
                           *(_Rb_tree_color *)
                            ((long)&(poVar33->
                                    super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                                    )._M_payload.
                                    super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                                    ._M_payload + 8);
                      local_140 = *(_Link_type *)
                                   ((long)&(poVar33->
                                           super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                                           )._M_payload.
                                           super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                                           .
                                           super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                                           ._M_payload._M_value._M_t._M_impl + 0x18);
                      p_Stack_138 = *(_Link_type *)
                                     ((long)&(poVar33->
                                             super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                                             )._M_payload.
                                             super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                                             .
                                             super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                                             ._M_payload._M_value._M_t._M_impl + 0x20);
                      *(_Link_type *)&((_Rb_tree_header *)&p_Var6->_M_parent)->_M_header = p_Var32;
                      *(_Base_ptr *)
                       ((long)&(poVar33->
                               super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                               )._M_payload.
                               super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                               ._M_payload._M_value._M_t._M_impl + 0x10) = (_Base_ptr)0x0;
                      *(_Base_ptr *)
                       ((long)&(poVar33->
                               super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                               )._M_payload.
                               super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                               ._M_payload._M_value._M_t._M_impl + 0x18) = p_Var1;
                      *(_Base_ptr *)
                       ((long)&(poVar33->
                               super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                               )._M_payload.
                               super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                               ._M_payload._M_value._M_t._M_impl + 0x20) = p_Var1;
                      *(size_t *)
                       ((long)&(poVar33->
                               super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                               )._M_payload.
                               super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                               ._M_payload._M_value._M_t._M_impl + 0x28) = 0;
                      p_Var25 = p_Var5;
                      p_Var15 = p_Var5;
                      local_148 = p_Var6;
                      local_130 = p_Var5;
                    }
                  }
                  else if (p_Var6 == (_Base_ptr)0x0) {
                    *(undefined4 *)
                     ((long)&(poVar33->
                             super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                             )._M_payload.
                             super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                             ._M_payload + 8) = local_158._8_4_;
                    *(_Base_ptr *)
                     ((long)&(poVar33->
                             super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                             )._M_payload.
                             super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                             ._M_payload + 0x10) = local_148;
                    *(_Link_type *)
                     ((long)&(poVar33->
                             super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                             )._M_payload.
                             super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                             ._M_payload._M_value._M_t._M_impl + 0x18) = local_140;
                    *(_Link_type *)
                     ((long)&(poVar33->
                             super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                             )._M_payload.
                             super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                             ._M_payload._M_value._M_t._M_impl + 0x20) = p_Stack_138;
                    *(undefined1 **)&((_Rb_tree_header *)&local_148->_M_parent)->_M_header =
                         (undefined1 *)
                         ((long)&(poVar33->
                                 super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                                 )._M_payload.
                                 super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                                 ._M_payload + 8);
                    *(_Link_type *)
                     ((long)&(poVar33->
                             super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                             )._M_payload.
                             super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                             ._M_payload + 0x28) = p_Var29;
                    local_148 = (_Base_ptr)0x0;
                    local_130 = (_Link_type)0x0;
                    p_Var25 = (_Link_type)0x0;
                    p_Var15 = (_Link_type)0x0;
                    local_140 = p_Var32;
                    p_Stack_138 = p_Var32;
                  }
                  else {
                    *(_Base_ptr *)
                     ((long)&(poVar33->
                             super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                             )._M_payload.
                             super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                             ._M_payload + 0x10) = local_148;
                    p_Var7 = *(_Link_type *)
                              ((long)&(poVar33->
                                      super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                                      )._M_payload.
                                      super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                                      ._M_payload._M_value._M_t._M_impl + 0x18);
                    *(_Link_type *)
                     ((long)&(poVar33->
                             super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                             )._M_payload.
                             super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                             ._M_payload._M_value._M_t._M_impl + 0x18) = local_140;
                    p_Var8 = *(_Link_type *)
                              ((long)&(poVar33->
                                      super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                                      )._M_payload.
                                      super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                                      ._M_payload._M_value._M_t._M_impl + 0x20);
                    *(_Link_type *)
                     ((long)&(poVar33->
                             super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                             )._M_payload.
                             super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                             ._M_payload._M_value._M_t._M_impl + 0x20) = p_Stack_138;
                    *(_Link_type *)&((_Rb_tree_header *)&p_Var6->_M_parent)->_M_header = p_Var32;
                    (*(_Base_ptr *)
                      ((long)&(poVar33->
                              super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                              )._M_payload.
                              super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                              ._M_payload._M_value._M_t._M_impl + 0x10))->_M_parent =
                         (_Base_ptr)
                         ((long)&(poVar33->
                                 super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                                 )._M_payload.
                                 super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                                 ._M_payload + 8);
                    *(_Link_type *)
                     ((long)&(poVar33->
                             super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                             )._M_payload.
                             super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                             ._M_payload + 0x28) = p_Var29;
                    p_Var25 = p_Var5;
                    p_Var15 = p_Var5;
                    local_148 = p_Var6;
                    local_140 = p_Var7;
                    p_Stack_138 = p_Var8;
                    local_130 = p_Var5;
                  }
                  CVar9.ctx_ptr =
                       *(TapSatisfier **)
                        &(poVar33->
                         super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                         ._M_payload._M_value._M_t._M_impl;
                  (poVar33->
                  super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                  )._M_payload.
                  super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                  .super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>.
                  _M_payload._M_value._M_t._M_impl.super__Rb_tree_key_compare<Comp> =
                       local_158._0_8_;
                  local_158._0_8_ = CVar9.ctx_ptr;
                }
                p_Var2 = (_Rb_tree_node_base *)
                         ((long)&(poVar33->
                                 super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                                 )._M_payload.
                                 super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                                 ._M_payload._M_value._M_t._M_impl + 8);
                p_Var17 = *(_Rb_tree_node_base **)
                           ((long)&(poVar33->
                                   super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                                   )._M_payload.
                                   super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                                   ._M_payload + 0x18);
                while (p_Var18 = p_Var17, p_Var18 != p_Var2) {
                  p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
                  pVar35 = std::
                           _Rb_tree<CPubKey,_CPubKey,_std::_Identity<CPubKey>,_Comp,_std::allocator<CPubKey>_>
                           ::_M_get_insert_unique_pos
                                     ((_Rb_tree<CPubKey,_CPubKey,_std::_Identity<CPubKey>,_Comp,_std::allocator<CPubKey>_>
                                       *)local_158,(key_type *)(p_Var18 + 1));
                  p_Var26 = pVar35.second;
                  p_Var25 = local_130;
                  p_Var15 = local_130;
                  if (p_Var26 != (_Rb_tree_node_base *)0x0) {
                    p_Var18 = (_Rb_tree_node_base *)
                              std::_Rb_tree_rebalance_for_erase(p_Var18,p_Var2);
                    psVar23 = (size_t *)
                              ((long)&(poVar33->
                                      super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                                      )._M_payload.
                                      super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                                      ._M_payload._M_value._M_t._M_impl + 0x28);
                    *psVar23 = *psVar23 - 1;
                    bVar12 = true;
                    if ((_Rb_tree_node_base *)(local_158 + 8) != p_Var26 &&
                        pVar35.first == (_Rb_tree_node_base *)0x0) {
                      bVar12 = ::operator<((CPubKey *)(p_Var18 + 1),(CPubKey *)(p_Var26 + 1));
                    }
                    std::_Rb_tree_insert_and_rebalance
                              (bVar12,p_Var18,(_Rb_tree_node_base *)p_Var26,
                               (_Rb_tree_node_base *)(local_158 + 8));
                    p_Var25 = (_Link_type)
                              ((long)&(local_130->super__Rb_tree_node_base)._M_color + 1);
                    p_Var15 = p_Var25;
                    local_130 = p_Var25;
                  }
                }
                p_Var29 = (_Link_type)
                          ((p_Var5->_M_storage)._M_storage + (long)(&p_Var29->_M_storage + -1) + 1);
                if (p_Var25 != p_Var29) {
                  *(undefined2 *)(lVar19 + 0xa0) = 0x101;
                  local_40 = 0;
                  goto LAB_00485a3f;
                }
                poVar33 = poVar33 + 1;
              } while (poVar33 != poVar31);
            }
            local_60 = local_148;
            *(undefined2 *)(lVar19 + 0xa0) = 0x100;
            local_70.ctx_ptr = (TapSatisfier *)local_158._0_8_;
            if (local_148 == (_Base_ptr)0x0) {
              _Var22 = _S_red;
              local_58 = (_Link_type)local_68;
              pp_Var30 = &local_48;
              p_Var29 = local_58;
            }
            else {
              *(_Rb_tree_color **)&((_Rb_tree_header *)&local_148->_M_parent)->_M_header = local_68;
              local_148 = (_Base_ptr)0x0;
              pp_Var30 = &local_130;
              local_58 = local_140;
              p_Var29 = p_Stack_138;
              _Var22 = local_158._8_4_;
              local_140 = (_Link_type)(local_158 + 8);
              p_Stack_138 = (_Link_type)(local_158 + 8);
              local_48 = p_Var15;
            }
            local_50 = p_Var29;
            *pp_Var30 = (_Link_type)0x0;
            local_40 = 1;
            local_68[0] = _Var22;
          }
          else {
            *(undefined2 *)(lVar19 + 0xa0) = 0x101;
            local_40 = 0;
          }
LAB_00485a3f:
          std::_Rb_tree<CPubKey,_CPubKey,_std::_Identity<CPubKey>,_Comp,_std::allocator<CPubKey>_>::
          _M_erase((_Rb_tree<CPubKey,_CPubKey,_std::_Identity<CPubKey>,_Comp,_std::allocator<CPubKey>_>
                    *)local_148,p_Var29);
          p_Var6 = local_60;
          local_80 = '\0';
          if ((local_40 & 1) != 0) {
            local_c8._24_8_ = local_70.ctx_ptr;
            if (local_60 == (_Base_ptr)0x0) {
              local_c8._32_4_ = _S_red;
              local_98 = (_Link_type)(local_c8 + 0x20);
              pp_Var30 = &local_88;
              p_Var29 = local_98;
            }
            else {
              *(undefined1 **)&((_Rb_tree_header *)&local_60->_M_parent)->_M_header =
                   local_c8 + 0x20;
              local_88 = local_48;
              local_60 = (_Base_ptr)0x0;
              pp_Var30 = &local_48;
              local_98 = local_58;
              p_Var29 = local_50;
              local_c8._32_4_ = local_68[0];
              local_58 = (_Link_type)local_68;
              local_50 = (_Link_type)local_68;
            }
            local_a0 = p_Var6;
            *pp_Var30 = (_Link_type)0x0;
            local_80 = '\x01';
            p_Stack_90 = p_Var29;
          }
        }
        poVar16 = local_198.
                  super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        local_78 = 1;
        lVar19 = *(long *)(lVar19 + 0x40) - *(long *)(lVar19 + 0x38) >> 4;
        poVar31 = local_198.
                  super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (lVar19 * -0x38 != 0) {
          poVar31 = local_198.
                    super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -lVar19;
          poVar33 = poVar31;
          do {
            if ((poVar33->
                super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                )._M_payload.
                super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                .super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>.
                _M_engaged == true) {
              (poVar33->
              super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>)
              ._M_payload.
              super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
              .super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>.
              _M_engaged = false;
              std::
              _Rb_tree<CPubKey,_CPubKey,_std::_Identity<CPubKey>,_Comp,_std::allocator<CPubKey>_>::
              _M_erase((_Rb_tree<CPubKey,_CPubKey,_std::_Identity<CPubKey>,_Comp,_std::allocator<CPubKey>_>
                        *)*(_Base_ptr *)
                           ((long)&(poVar33->
                                   super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                                   )._M_payload.
                                   super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                                   ._M_payload._M_value._M_t._M_impl + 0x10),p_Var29);
            }
            poVar33 = poVar33 + 1;
          } while (poVar33 != poVar16);
        }
        local_198.
        super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = poVar31;
        poVar31 = local_198.
                  super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        poVar16 = local_198.
                  super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_198.
            super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_198.
            super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          if ((long)local_198.
                    super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_198.
                    super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
            if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00486108;
            std::__throw_length_error("vector::_M_realloc_insert");
            goto LAB_0048604f;
          }
          lVar19 = (long)local_198.
                         super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_198.
                         super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3;
          uVar34 = lVar19 * 0x6db6db6db6db6db7;
          uVar20 = uVar34;
          if (local_198.
              super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_198.
              super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar20 = 1;
          }
          uVar27 = uVar20 + uVar34;
          if (0x249249249249248 < uVar27) {
            uVar27 = 0x249249249249249;
          }
          if (CARRY8(uVar20,uVar34)) {
            uVar27 = 0x249249249249249;
          }
          if (uVar27 == 0) {
            poVar33 = (pointer)0x0;
          }
          else {
            poVar33 = (pointer)operator_new(uVar27 * 0x38);
          }
          lVar19 = lVar19 * 8;
          (&(poVar33->
            super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>).
            _M_payload.
            super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
            .super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>.
            _M_engaged)[lVar19] = false;
          poVar10 = poVar33;
          poVar11 = poVar16;
          if (local_80 == '\x01') {
            puVar21 = (undefined8 *)
                      ((long)&(poVar33->
                              super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                              )._M_payload.
                              super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                              ._M_payload + lVar19);
            *puVar21 = local_c8._24_8_;
            p_Var15 = (_Link_type)(puVar21 + 1);
            if (local_a0 == (_Base_ptr)0x0) {
              puVar21[2] = 0;
              pp_Var30 = (_Link_type *)(puVar21 + 5);
              _Var22 = _S_red;
              p_Var29 = p_Var15;
            }
            else {
              puVar21[2] = local_a0;
              *(_Link_type *)&((_Rb_tree_header *)&local_a0->_M_parent)->_M_header = p_Var15;
              puVar21[5] = local_88;
              local_a0 = (_Base_ptr)0x0;
              pp_Var30 = &local_88;
              p_Var15 = local_98;
              p_Var29 = p_Stack_90;
              _Var22 = local_c8._32_4_;
              local_98 = (_Link_type)(local_c8 + 0x20);
              p_Stack_90 = (_Link_type)(local_c8 + 0x20);
            }
            puVar21[3] = p_Var15;
            puVar21[4] = p_Var29;
            *pp_Var30 = (_Link_type)0x0;
            *(_Rb_tree_color *)(puVar21 + 1) = _Var22;
            *(undefined1 *)(puVar21 + 6) = 1;
          }
          for (; poVar31 != poVar11; poVar11 = poVar11 + 1) {
            (poVar10->
            super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>).
            _M_payload.
            super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
            .super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>.
            _M_engaged = false;
            bVar14 = (poVar11->
                     super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                     ._M_engaged;
            if ((bool)bVar14 == true) {
              (poVar10->
              super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>)
              ._M_payload.
              super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
              .super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>.
              _M_payload._M_value._M_t._M_impl.super__Rb_tree_key_compare<Comp> =
                   (poVar11->
                   super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                   )._M_payload.
                   super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                   .super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                   ._M_payload._M_value._M_t._M_impl.super__Rb_tree_key_compare<Comp>;
              p_Var29 = (_Link_type)
                        ((long)&(poVar11->
                                super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                                )._M_payload.
                                super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                                ._M_payload._M_value._M_t._M_impl + 8);
              std::_Rb_tree_header::_Rb_tree_header
                        ((_Rb_tree_header *)
                         ((long)&(poVar10->
                                 super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                                 )._M_payload.
                                 super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                                 ._M_payload._M_value._M_t._M_impl + 8),(_Rb_tree_header *)p_Var29);
              (poVar10->
              super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>)
              ._M_payload.
              super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
              .super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>.
              _M_engaged = true;
              bVar14 = (poVar11->
                       super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                       ._M_engaged;
            }
            if ((bVar14 & 1) != 0) {
              (poVar11->
              super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>)
              ._M_payload.
              super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
              .super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>.
              _M_engaged = false;
              std::
              _Rb_tree<CPubKey,_CPubKey,_std::_Identity<CPubKey>,_Comp,_std::allocator<CPubKey>_>::
              _M_erase((_Rb_tree<CPubKey,_CPubKey,_std::_Identity<CPubKey>,_Comp,_std::allocator<CPubKey>_>
                        *)*(_Base_ptr *)
                           ((long)&(poVar11->
                                   super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                                   )._M_payload.
                                   super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                                   ._M_payload._M_value._M_t._M_impl + 0x10),p_Var29);
            }
            poVar10 = poVar10 + 1;
          }
          if (poVar16 != (pointer)0x0) {
            p_Var29 = (_Link_type)
                      ((long)local_198.
                             super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)poVar16);
            operator_delete(poVar16,(ulong)p_Var29);
          }
          local_198.
          super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = poVar33 + uVar27;
          local_198.
          super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = poVar33;
          local_198.
          super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = poVar10;
        }
        else {
          ((local_198.
            super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->
          super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>).
          _M_payload.
          super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
          .super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>.
          _M_engaged = false;
          if (local_80 == '\x01') {
            ((local_198.
              super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->
            super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>).
            _M_payload.
            super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
            .super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>.
            _M_payload._M_value._M_t._M_impl.super__Rb_tree_key_compare<Comp> = local_c8._24_8_;
            p_Var6 = (_Base_ptr)
                     ((long)&((local_198.
                               super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish)->
                             super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                             )._M_payload.
                             super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                             ._M_payload + 8);
            if (local_a0 == (_Base_ptr)0x0) {
              *(_Base_ptr *)
               ((long)&((local_198.
                         super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                       ._M_payload._M_value._M_t._M_impl + 0x10) = (_Base_ptr)0x0;
              *(_Base_ptr *)
               ((long)&((local_198.
                         super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                       ._M_payload._M_value._M_t._M_impl + 0x18) = p_Var6;
              *(_Base_ptr *)
               ((long)&((local_198.
                         super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                       ._M_payload._M_value._M_t._M_impl + 0x20) = p_Var6;
              psVar23 = (size_t *)
                        ((long)&((local_198.
                                  super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish)->
                                super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                                )._M_payload.
                                super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                                ._M_payload._M_value._M_t._M_impl + 0x28);
              _Var22 = _S_red;
            }
            else {
              *(_Base_ptr *)
               ((long)&((local_198.
                         super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                       ._M_payload + 0x10) = local_a0;
              *(_Link_type *)
               ((long)&((local_198.
                         super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                       ._M_payload._M_value._M_t._M_impl + 0x18) = local_98;
              *(_Link_type *)
               ((long)&((local_198.
                         super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                       ._M_payload._M_value._M_t._M_impl + 0x20) = p_Stack_90;
              *(_Base_ptr *)&((_Rb_tree_header *)&local_a0->_M_parent)->_M_header = p_Var6;
              *(_Link_type *)
               ((long)&((local_198.
                         super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                       ._M_payload._M_value._M_t._M_impl + 0x28) = local_88;
              local_a0 = (_Base_ptr)0x0;
              local_98 = (_Link_type)(local_c8 + 0x20);
              psVar23 = (size_t *)&local_88;
              _Var22 = local_c8._32_4_;
              p_Stack_90 = local_98;
            }
            *psVar23 = 0;
            *(_Rb_tree_color *)
             ((long)&((local_198.
                       super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->
                     super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                     ._M_payload + 8) = _Var22;
            ((local_198.
              super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->
            super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>).
            _M_payload.
            super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
            .super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>.
            _M_engaged = true;
          }
        }
        poVar31 = local_198.
                  super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + 1;
        pvVar28 = (void *)((long)pvStack_170 + -0x18);
        local_198.
        super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = poVar31;
        pvStack_170 = pvVar28;
        if (((local_78 & 1) != 0) && (local_78 = 0, local_80 == '\x01')) {
          local_80 = '\0';
          std::_Rb_tree<CPubKey,_CPubKey,_std::_Identity<CPubKey>,_Comp,_std::allocator<CPubKey>_>::
          _M_erase((_Rb_tree<CPubKey,_CPubKey,_std::_Identity<CPubKey>,_Comp,_std::allocator<CPubKey>_>
                    *)local_a0,p_Var29);
        }
      }
      poVar16 = local_198.
                super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (pvVar28 != local_178);
  }
  pvVar28 = local_178;
  if ((long)poVar31 - (long)poVar16 == 0x38) {
    local_c8[8] = '\0';
    if ((poVar16->
        super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>).
        _M_payload.
        super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
        .super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>._M_engaged
        == true) {
      local_100._16_8_ =
           (poVar16->
           super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>).
           _M_payload.
           super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
           .super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>.
           _M_payload._M_value._M_t._M_impl.super__Rb_tree_key_compare<Comp>;
      local_d8 = (_Rb_tree_node_base *)(local_100 + 0x18);
      local_e0 = *(_Base_ptr *)
                  ((long)&(poVar16->
                          super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                          )._M_payload.
                          super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                          ._M_payload._M_value._M_t._M_impl + 0x10);
      if (local_e0 == (_Base_ptr)0x0) {
        psVar23 = (size_t *)local_c8;
        local_e0 = (_Base_ptr)0x0;
        local_100._24_4_ = _S_red;
        p_Stack_d0 = local_d8;
      }
      else {
        p_Var6 = (_Base_ptr)
                 ((long)&(poVar16->
                         super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                         ._M_payload + 8);
        local_100._24_4_ =
             *(_Rb_tree_color *)
              ((long)&(poVar16->
                      super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                      )._M_payload.
                      super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                      ._M_payload + 8);
        p_Var26 = *(_Base_ptr *)
                   ((long)&(poVar16->
                           super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                           )._M_payload.
                           super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                           ._M_payload._M_value._M_t._M_impl + 0x18);
        p_Stack_d0 = *(_Base_ptr *)
                      ((long)&(poVar16->
                              super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                              )._M_payload.
                              super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                              ._M_payload._M_value._M_t._M_impl + 0x20);
        *(_Rb_tree_node_base **)&((_Rb_tree_header *)&local_e0->_M_parent)->_M_header = local_d8;
        psVar23 = (size_t *)
                  ((long)&(poVar16->
                          super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                          )._M_payload.
                          super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                          ._M_payload._M_value._M_t._M_impl + 0x28);
        local_c8._0_8_ =
             *(size_t *)
              ((long)&(poVar16->
                      super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                      )._M_payload.
                      super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                      ._M_payload._M_value._M_t._M_impl + 0x28);
        *(_Base_ptr *)
         ((long)&(poVar16->
                 super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                 .super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>.
                 _M_payload._M_value._M_t._M_impl + 0x10) = (_Base_ptr)0x0;
        *(_Base_ptr *)
         ((long)&(poVar16->
                 super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                 .super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>.
                 _M_payload._M_value._M_t._M_impl + 0x18) = p_Var6;
        *(_Base_ptr *)
         ((long)&(poVar16->
                 super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                 .super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>.
                 _M_payload._M_value._M_t._M_impl + 0x20) = p_Var6;
        local_d8 = p_Var26;
      }
      *psVar23 = 0;
      local_c8[8] = '\x01';
    }
    local_c8[0x10] = '\x01';
    std::
    vector<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
    ::~vector(&local_198);
    if (pvVar28 != (void *)0x0) {
      operator_delete(pvVar28,local_168 - (long)pvVar28);
    }
    p_Var6 = local_e0;
    if (local_c8[8] == '\x01') {
      local_120._M_left = &local_120;
      local_128 = (_Base_ptr)local_100._16_8_;
      if (local_e0 == (_Base_ptr)0x0) {
        local_120._M_color = _S_red;
        p_Var29 = (_Link_type)local_100;
        local_120._M_right = local_120._M_left;
      }
      else {
        p_Var29 = (_Link_type)local_c8;
        *(_Base_ptr *)&((_Rb_tree_header *)&local_e0->_M_parent)->_M_header = local_120._M_left;
        local_100._0_8_ = local_c8._0_8_;
        local_120._M_left = local_d8;
        local_120._M_right = p_Stack_d0;
        local_120._M_color = local_100._24_4_;
      }
      local_120._M_parent = local_e0;
      *(undefined8 *)&p_Var29->super__Rb_tree_node_base = 0;
      local_100[8] = 0;
      std::_Rb_tree<CPubKey,_CPubKey,_std::_Identity<CPubKey>,_Comp,_std::allocator<CPubKey>_>::
      _M_erase((_Rb_tree<CPubKey,_CPubKey,_std::_Identity<CPubKey>,_Comp,_std::allocator<CPubKey>_>
                *)p_Var6,p_Var29);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
LAB_00486108:
    __stack_chk_fail();
  }
LAB_0048604f:
  __assert_fail("results.size() == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                ,0x27e,
                "std::optional<Result> miniscript::Node<CPubKey>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = CPubKey, Result = std::optional<std::set<CPubKey, Comp>>, State = DummyState, DownFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:678:13), UpFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:679:13)]"
               );
}

Assistant:

void DuplicateKeyCheck(const Ctx& ctx) const
    {
        // We cannot use a lambda here, as lambdas are non assignable, and the set operations
        // below require moving the comparators around.
        struct Comp {
            const Ctx* ctx_ptr;
            Comp(const Ctx& ctx) : ctx_ptr(&ctx) {}
            bool operator()(const Key& a, const Key& b) const { return ctx_ptr->KeyCompare(a, b); }
        };

        // state in the recursive computation:
        // - std::nullopt means "this node has duplicates"
        // - an std::set means "this node has no duplicate keys, and they are: ...".
        using keyset = std::set<Key, Comp>;
        using state = std::optional<keyset>;

        auto upfn = [&ctx](const Node& node, Span<state> subs) -> state {
            // If this node is already known to have duplicates, nothing left to do.
            if (node.has_duplicate_keys.has_value() && *node.has_duplicate_keys) return {};

            // Check if one of the children is already known to have duplicates.
            for (auto& sub : subs) {
                if (!sub.has_value()) {
                    node.has_duplicate_keys = true;
                    return {};
                }
            }

            // Start building the set of keys involved in this node and children.
            // Start by keys in this node directly.
            size_t keys_count = node.keys.size();
            keyset key_set{node.keys.begin(), node.keys.end(), Comp(ctx)};
            if (key_set.size() != keys_count) {
                // It already has duplicates; bail out.
                node.has_duplicate_keys = true;
                return {};
            }

            // Merge the keys from the children into this set.
            for (auto& sub : subs) {
                keys_count += sub->size();
                // Small optimization: std::set::merge is linear in the size of the second arg but
                // logarithmic in the size of the first.
                if (key_set.size() < sub->size()) std::swap(key_set, *sub);
                key_set.merge(*sub);
                if (key_set.size() != keys_count) {
                    node.has_duplicate_keys = true;
                    return {};
                }
            }

            node.has_duplicate_keys = false;
            return key_set;
        };

        TreeEval<state>(upfn);
    }